

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseDirective(Parser *this,DirectiveMap *directiveSet)

{
  uint uVar1;
  Token *token;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
  _Var2;
  Architecture *pAVar3;
  Token *pTVar4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *in_RDX;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_false,_true>_>
  pVar5;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> result;
  pointer local_30;
  
  token = Tokenizer::peekToken(*(Tokenizer **)((directiveSet->_M_h)._M_bucket_count - 0x18),0);
  if (token->type == Identifier) {
    if ((token->value).super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        _M_index != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    pVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::equal_range(in_RDX,(key_type *)&token->value);
    for (_Var2._M_cur = (__node_type *)
                        pVar5.first.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
                        ._M_cur;
        (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
         )_Var2._M_cur !=
        pVar5.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
        ; _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt) {
      uVar1 = *(uint *)((long)&((_Var2._M_cur)->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>_>
                               ._M_storage._M_storage + 0x28);
      if (((((uVar1 >> 0x13 & 1) == 0) && (((byte)(uVar1 >> 0x11) & 1 & Global.nocash) == 0)) &&
          ((uVar1 >> 0x10 & 1) == 0 || (Global.nocash & 1U) != 0)) &&
         (((uVar1 >> 0x14 & 1) == 0 || ((Global.memoryMode & 1U) == 0)))) {
        if ((uVar1 >> 0x12 & 1) != 0) {
          pAVar3 = Architecture::current();
          (*pAVar3->_vptr_Architecture[3])(pAVar3);
        }
        Tokenizer::eatTokens(*(Tokenizer **)((directiveSet->_M_h)._M_bucket_count - 0x18),1);
        (**(code **)((long)&((_Var2._M_cur)->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>_>
                            ._M_storage._M_storage + 0x20))
                  (&local_30,directiveSet,
                   *(undefined4 *)
                    ((long)&((_Var2._M_cur)->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>_>
                            ._M_storage._M_storage + 0x28));
        if (local_30 == (pointer)0x0) {
          if (*(char *)((long)&directiveSet[2]._M_h._M_bucket_count + 1) == '\0') {
            printError<>((Parser *)directiveSet,token,"Directive parameter failure");
          }
        }
        else {
          if (((((_Var2._M_cur)->
                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
                ).
                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>_>
                ._M_storage._M_storage.__data[0x2a] & 0x20) != 0) ||
             (pTVar4 = Tokenizer::nextToken
                                 (*(Tokenizer **)((directiveSet->_M_h)._M_bucket_count - 0x18)),
             pTVar4->type == Separator)) {
            (this->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_start = local_30;
            local_30 = (pointer)0x0;
            goto LAB_001473fd;
          }
          printError<>((Parser *)directiveSet,token,"Directive not terminated");
        }
        (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_001473fd:
        if (local_30 == (pointer)0x0) {
          return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
        }
        (*(code *)(local_30->tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>.
                  _M_impl._M_node.super__List_node_base._M_prev)();
        return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
      }
    }
  }
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseDirective(const DirectiveMap &directiveSet)
{
	const Token &tok = peekToken();
	if (tok.type != TokenType::Identifier)
		return nullptr;

	const std::string &stringValue = tok.identifierValue().string();

	auto matchRange = directiveSet.equal_range(stringValue);
	for (auto it = matchRange.first; it != matchRange.second; ++it)
	{
		const DirectiveEntry &directive = it->second;

		if (directive.flags & DIRECTIVE_DISABLED)
			continue;
		if ((directive.flags & DIRECTIVE_NOCASHOFF) && Global.nocash)
			continue;
		if ((directive.flags & DIRECTIVE_NOCASHON) && !Global.nocash)
			continue;
		if ((directive.flags & DIRECTIVE_NOTINMEMORY) && Global.memoryMode)
			continue;

		if (directive.flags & DIRECTIVE_MIPSRESETDELAY)
			Architecture::current().NextSection();

		eatToken();
		std::unique_ptr<CAssemblerCommand> result = directive.function(*this,directive.flags);
		if (result == nullptr)
		{
			if (!hasError())
				printError(tok, "Directive parameter failure");
			return nullptr;
		} else if (!(directive.flags & DIRECTIVE_MANUALSEPARATOR) && nextToken().type != TokenType::Separator)
		{
			printError(tok, "Directive not terminated");
			return nullptr;
		}

		return result;
	}

	return nullptr;
}